

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O2

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSize(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  QPageSize *ps;
  QPageSize *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QPageSize::isValid();
  if (cVar1 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QPageSize::QPageSize((QPageSize *)this);
      return this;
    }
    goto LAB_0012bf81;
  }
  if (pageSize[0x6b] == (QPageSize)0x0) {
    (**(code **)(*(long *)pageSize + 0x130))(pageSize);
  }
  iVar3 = QPageSize::id();
  if (iVar3 != 0x1f) {
    pQVar5 = *(QPageSize **)(pageSize + 0x78);
    for (lVar6 = *(long *)(pageSize + 0x80) << 3; lVar6 != 0; lVar6 = lVar6 + -8) {
      iVar3 = QPageSize::id();
      iVar4 = QPageSize::id();
      if (iVar3 == iVar4) {
        QPageSize::name();
        QPageSize::name();
        bVar2 = comparesEqual((QString *)&local_50,(QString *)&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        if (bVar2) goto LAB_0012bf50;
      }
      pQVar5 = pQVar5 + 8;
    }
  }
  iVar3 = QPageSize::id();
  if (iVar3 != 0x1f) {
    pQVar5 = *(QPageSize **)(pageSize + 0x78);
    for (lVar6 = *(long *)(pageSize + 0x80) << 3; lVar6 != 0; lVar6 = lVar6 + -8) {
      iVar3 = QPageSize::id();
      iVar4 = QPageSize::id();
      if (iVar3 == iVar4) goto LAB_0012bf50;
      pQVar5 = pQVar5 + 8;
    }
  }
  supportedPageSizeMatch(this,pageSize);
  goto LAB_0012bf5f;
LAB_0012bf50:
  QPageSize::QPageSize((QPageSize *)this,pQVar5);
LAB_0012bf5f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
LAB_0012bf81:
  __stack_chk_fail();
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSize(const QPageSize &pageSize) const
{
    if (!pageSize.isValid())
        return QPageSize();

    if (!m_havePageSizes)
        loadPageSizes();

    // First try match on name and id for case where printer defines same size twice with different names
    // e.g. Windows defines DMPAPER_11X17 and DMPAPER_TABLOID with names "11x17" and "Tabloid", but both
    // map to QPageSize::Tabloid / PPD Key "Tabloid" / ANSI B Tabloid
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id() && ps.name() == pageSize.name())
                return ps;
        }
    }

    // Next try match on id only if not custom
    if (pageSize.id() != QPageSize::Custom) {
        for (const QPageSize &ps : std::as_const(m_pageSizes)) {
            if (ps.id() == pageSize.id())
                return ps;
        }
    }

    // Next try a match on size, in case it's a custom with a different name
    return supportedPageSizeMatch(pageSize);
}